

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O3

bool __thiscall
QPDFNumberTreeObjectHelper::findObjectAtOrBelow
          (QPDFNumberTreeObjectHelper *this,numtree_number idx,QPDFObjectHandle *oh,
          numtree_number *offset)

{
  bool bVar1;
  iterator i;
  numtree_number local_90;
  iterator local_88;
  iterator local_58;
  
  local_90 = idx;
  find(&local_88,this,idx,true);
  end(&local_58,this);
  bVar1 = NNTreeIterator::operator==
                    (local_88.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_58.impl.
                            super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iterator::~iterator(&local_58);
  if (!bVar1) {
    iterator::updateIValue(&local_88);
    (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_88.ivalue.second.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(oh->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_88.ivalue.second.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
    iterator::updateIValue(&local_88);
    if ((local_88.ivalue.first ^ idx) < 0) {
      QIntC::range_check_subtract_error<long_long>(&local_90,&local_88.ivalue.first);
      idx = local_90;
    }
    iterator::updateIValue(&local_88);
    *offset = idx - local_88.ivalue.first;
  }
  iterator::~iterator(&local_88);
  return !bVar1;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::findObjectAtOrBelow(
    numtree_number idx, QPDFObjectHandle& oh, numtree_number& offset)
{
    auto i = find(idx, true);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    QIntC::range_check_subtract(idx, i->first);
    offset = idx - i->first;
    return true;
}